

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O2

shared_ptr<ccs::CcsTracer> __thiscall
ccs::CcsTracer::makeLoggingTracer
          (CcsTracer *this,shared_ptr<ccs::CcsLogger> *logger,bool logAccesses)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _func_int **pp_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<ccs::CcsTracer> sVar4;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ccs::(anonymous_namespace)::LoggingTracer,_std::allocator<ccs::(anonymous_namespace)::LoggingTracer>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_50;
  undefined8 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pp_Var3 = (_func_int **)operator_new(0x30);
  local_50._M_alloc = &__a2;
  pp_Var3[1] = (_func_int *)0x100000001;
  *pp_Var3 = (_func_int *)&PTR___Sp_counted_ptr_inplace_00197278;
  peVar1 = (logger->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (logger->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (logger->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (logger->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pp_Var3[2] = (_func_int *)&PTR__LoggingTracer_001972c8;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pp_Var3[3] = (_func_int *)peVar1;
  pp_Var3[4] = (_func_int *)p_Var2;
  local_40 = 0;
  *(bool *)(pp_Var3 + 5) = logAccesses;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  local_50._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ccs::(anonymous_namespace)::LoggingTracer,_std::allocator<ccs::(anonymous_namespace)::LoggingTracer>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_50);
  this->_vptr_CcsTracer = pp_Var3 + 2;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this[1]._vptr_CcsTracer = pp_Var3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  sVar4.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<ccs::CcsTracer>)
         sVar4.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CcsTracer> CcsTracer::makeLoggingTracer(
  std::shared_ptr<CcsLogger> logger, bool logAccesses) {
  return std::make_shared<LoggingTracer>(std::move(logger), logAccesses);
}